

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  pointer pPVar1;
  SectionNode *sectionNode;
  pointer pcVar2;
  string className;
  string local_60;
  string local_40;
  
  pPVar1 = (testCaseNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(testCaseNode->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 8) {
    sectionNode = pPVar1->m_p;
    pcVar2 = (testCaseNode->value).testInfo.className._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,
               pcVar2 + (testCaseNode->value).testInfo.className._M_string_length);
    if ((local_60._M_string_length == 0) &&
       ((sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x19dd19);
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    writeSection(this,&local_60,&local_40,sectionNode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/catch.hpp"
                ,0x208c,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

bool compare( int lhs, unsigned long rhs ) {
        return applyEvaluator<Op>( static_cast<unsigned int>( lhs ), rhs );
    }